

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O2

void __thiscall ServeStaticContent_Simple_Test::TestBody(ServeStaticContent_Simple_Test *this)

{
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *this_00;
  string *psVar1;
  istream *piVar2;
  tuple<unsigned_long,_pstore::http::request_info> *ptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  tuple<unsigned_long,_int> *ptVar5;
  UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *matcher;
  char *pcVar6;
  char *in_R9;
  error_code eVar7;
  error_code erc;
  error_code erc_00;
  error_code erc_01;
  error_code erc_02;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffa90;
  string version;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  headers;
  error_or_n<std::string::size_type,_int> eo;
  reader r;
  undefined8 local_4d0;
  AssertionResult gtest_ar_;
  bool local_460;
  undefined1 local_458 [64];
  request_info local_418;
  string method;
  error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> actual;
  string uri;
  istringstream is;
  _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  
  std::__cxx11::string::string((string *)&is,"/index.html",(allocator *)&gtest_ar_);
  anon_unknown.dwarf_ce6d8::ServeStaticContent::serve_path
            (&actual,&this->super_ServeStaticContent,(string *)&is);
  std::__cxx11::string::~string((string *)&is);
  gtest_ar_.success_ = (bool)(actual.has_error_ ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (actual.has_error_ != false) {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&is,(internal *)&gtest_ar_,(AssertionResult *)"static_cast<bool> (actual)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_548,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,0x73,_is);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_548,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_548);
    std::__cxx11::string::~string((string *)&is);
    if ((long *)local_418.method_._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_418.method_._M_dataplus._M_p + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_00133017;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  headers.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  headers.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r.src_ = pstore::error_or<std::__cxx11::string>::
           value_storage_impl<pstore::error_or<std::__cxx11::string>const&,std::__cxx11::string_const>
                     (&actual);
  (anonymous_namespace)::reader::gets_abi_cxx11_((reader *)&local_548,(char *)&r);
  if (local_548.second.field_2._M_local_buf[0] == '\0') {
    this_00 = (maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *)pstore::
                 error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>::
                 value_storage_impl<pstore::error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>const&,std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>const>
                           ((error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                             *)&local_548);
    _is = *(pointer *)(this_00 + 1);
    if (this_00->valid_ == false) {
      eVar7 = pstore::http::details::out_of_data_error();
      goto LAB_00132a53;
    }
    pbVar4 = pstore::
             maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator->(this_00);
    pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>::
    error_or<unsigned_long&,std::__cxx11::string_const&>
              ((error_or<std::tuple<unsigned_long,std::__cxx11::string>> *)local_458,&is,pbVar4);
  }
  else {
    eVar7 = pstore::
            error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
            ::get_error((error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
                         *)&local_548);
LAB_00132a53:
    erc._M_cat = eVar7._M_cat;
    erc._4_4_ = 0;
    erc._M_value = eVar7._M_value;
    pstore::
    error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::error_or((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_458,erc);
  }
  if (local_458[0x28] == false) {
    psVar1 = (string *)
             pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>::
             value_storage_impl<pstore::error_or<std::tuple<unsigned_long,std::__cxx11::string>>const&,std::tuple<unsigned_long,std::__cxx11::string>const>
                       ((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_458);
    local_4d0 = *(undefined8 *)(psVar1 + 0x20);
    std::__cxx11::istringstream::istringstream((istringstream *)&is,psVar1,_S_in);
    method._M_dataplus._M_p = (pointer)&method.field_2;
    method._M_string_length = 0;
    uri._M_dataplus._M_p = (pointer)&uri.field_2;
    uri._M_string_length = 0;
    method.field_2._M_local_buf[0] = '\0';
    uri.field_2._M_local_buf[0] = '\0';
    version._M_dataplus._M_p = (pointer)&version.field_2;
    version._M_string_length = 0;
    version.field_2._M_local_buf[0] = '\0';
    piVar2 = std::operator>>((istream *)&is,(string *)&method);
    piVar2 = std::operator>>(piVar2,(string *)&uri);
    std::operator>>(piVar2,(string *)&version);
    if (((method._M_string_length == 0) || (uri._M_string_length == 0)) ||
       (version._M_string_length == 0)) {
      eVar7 = pstore::http::details::out_of_data_error();
      erc_01._M_cat = eVar7._M_cat;
      erc_01._4_4_ = 0;
      erc_01._M_value = eVar7._M_value;
      pstore::error_or<std::tuple<unsigned_long,_pstore::http::request_info>_>::error_or
                ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)&gtest_ar_,
                 erc_01);
    }
    else {
      pstore::http::request_info::request_info(&local_418,&method,&uri,&version);
      pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>::
      error_or<unsigned_long&,pstore::http::request_info>
                ((error_or<std::tuple<unsigned_long,pstore::http::request_info>> *)&gtest_ar_,
                 &local_4d0,&local_418);
      pstore::http::request_info::~request_info(&local_418);
    }
    std::__cxx11::string::~string((string *)&version);
    std::__cxx11::string::~string((string *)&uri);
    std::__cxx11::string::~string((string *)&method);
    std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  }
  else {
    eVar7 = pstore::
            error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::get_error((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_458);
    erc_00._M_cat = eVar7._M_cat;
    erc_00._4_4_ = 0;
    erc_00._M_value = eVar7._M_value;
    pstore::error_or<std::tuple<unsigned_long,_pstore::http::request_info>_>::error_or
              ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)&gtest_ar_,erc_00
              );
  }
  pstore::
  error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~error_or((error_or<std::tuple<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
  pstore::
  error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
  ::~error_or((error_or<std::tuple<unsigned_long,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
               *)&local_548);
  if (local_460 == false) {
    ptVar3 = pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>::
             value_storage_impl<pstore::error_or<std::tuple<unsigned_long,pstore::http::request_info>>const&,std::tuple<unsigned_long,pstore::http::request_info>const>
                       ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)
                        &gtest_ar_);
    pstore::http::operator()
              (&eo,(http *)&r,
               (reader *)
               (ptVar3->super__Tuple_impl<0UL,_unsigned_long,_pstore::http::request_info>).
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl,(state_type)&headers,
               (anon_class_8_1_b2c1a266)0x0,(int)in_R9);
  }
  else {
    eVar7 = pstore::error_or<std::tuple<unsigned_long,_pstore::http::request_info>_>::get_error
                      ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)
                       &gtest_ar_);
    erc_02._M_cat = eVar7._M_cat;
    erc_02._4_4_ = 0;
    erc_02._M_value = eVar7._M_value;
    pstore::error_or<std::tuple<unsigned_long,_int>_>::error_or(&eo,erc_02);
  }
  pstore::error_or<std::tuple<unsigned_long,_pstore::http::request_info>_>::~error_or
            ((error_or<std::tuple<unsigned_long,_pstore::http::request_info>_> *)&gtest_ar_);
  gtest_ar_.success_ = (bool)(eo.has_error_ ^ 1);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (eo.has_error_ == false) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[15],_const_char_(&)[3],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&gtest_ar_,(char (*) [15])"content-length",(char (*) [3])0x16f5ce);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[13],_const_char_(&)[10],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_418,(char (*) [13])"content-type",(char (*) [10])"text/html");
    pcVar6 = "";
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[5],_const_char_(&)[1],_true>
              (&local_548,(char (*) [5])"date",(char (*) [1])0x1770dc);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[11],_const_char_(&)[6],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_458,(char (*) [11])"connection",(char (*) [6])0x1736fc);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_const_char_(&)[30],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&method,(char (*) [14])"last-modified",
               (char (*) [30])"Tue, 23 Apr 2019 09:10:27 GMT");
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[7],_const_char_(&)[12],_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&uri,(char (*) [7])"server",(char (*) [12])"pstore-http");
    testing::
    UnorderedElementsAre<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_190,(testing *)&gtest_ar_,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_418,&local_548,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_458,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&method,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&uri,in_stack_fffffffffffffa90);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
              ((PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&is,(internal *)&local_190,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
    ::operator()(&version,(char *)&is,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)"headers");
    std::
    _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&is);
    std::
    _Tuple_impl<0UL,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Tuple_impl(&local_190);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&uri);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&method);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_458);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_548);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_418);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar_);
    if ((char)version._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&is);
      if (version._M_string_length != 0) {
        pcVar6 = *(char **)version._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
                 ,0x8f,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&is);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
      if ((long *)_is != (long *)0x0) {
        (**(code **)(*(long *)_is + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&version._M_string_length);
    pbVar4 = pstore::error_or<std::__cxx11::string>::
             value_storage_impl<pstore::error_or<std::__cxx11::string>const&,std::__cxx11::string_const>
                       (&actual);
    ptVar5 = pstore::error_or<std::tuple<unsigned_long,int>>::
             value_storage_impl<pstore::error_or<std::tuple<unsigned_long,int>>const&,std::tuple<unsigned_long,int>const>
                       (&eo);
    std::__cxx11::string::string
              ((string *)&is,(string *)pbVar4,
               (ptVar5->super__Tuple_impl<0UL,_unsigned_long,_int>).
               super__Head_base<0UL,_unsigned_long,_false>._M_head_impl,(allocator *)&local_418);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
              ((internal *)&gtest_ar_,"(std::string{*actual, pstore::get<0> (eo)})","index_html",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&is,
               (char (*) [29])"<!DOCTYPE html><html></html>");
    std::__cxx11::string::~string((string *)&is);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&is);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_418,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
                 ,0x90,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_418,(Message *)&is);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_418);
      if ((long *)_is != (long *)0x0) {
        (**(code **)(*(long *)_is + 8))();
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&is,(internal *)&gtest_ar_,(AssertionResult *)"static_cast<bool> (eo)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_548,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,0x89,_is);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_548,(Message *)&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_548);
    std::__cxx11::string::~string((string *)&is);
    if ((long *)local_418.method_._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_418.method_._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::error_or<std::tuple<unsigned_long,_int>_>::~error_or(&eo);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&headers);
LAB_00133017:
  pstore::error_or<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~error_or(&actual);
  return;
}

Assistant:

TEST_F (ServeStaticContent, Simple) {
    pstore::error_or<std::string> const actual = serve_path ("/index.html");
    ASSERT_TRUE (static_cast<bool> (actual));

    using string_pair = std::pair<std::string, std::string>;
    std::vector<string_pair> headers;

    reader r{*actual};
    auto const record_headers = [&r, &headers] (reader::state_type io,
                                                pstore::http::request_info const &) {
        auto record_header = [&headers] (int io2, std::string const & key,
                                         std::string const & value) {
            // The date value will change according to when the test is run so we preserve its
            // presence but drop its value.
            headers.emplace_back (key, (key == "date") ? "" : value);
            return io2 + 1;
        };

        return pstore::http::read_headers (r, io, record_header, 0);
    };

    pstore::error_or_n<std::string::size_type, int> const eo =
        pstore::http::read_request (r, std::string::size_type{0}) >>= record_headers;

    ASSERT_TRUE (static_cast<bool> (eo));
    EXPECT_THAT (headers,
                 ::testing::UnorderedElementsAre (
                     string_pair{"content-length", "28"}, string_pair{"content-type", "text/html"},
                     string_pair{"date", ""}, string_pair{"connection", "close"},
                     string_pair{"last-modified", "Tue, 23 Apr 2019 09:10:27 GMT"},
                     string_pair{"server", "pstore-http"}));
    EXPECT_EQ ((std::string{*actual, pstore::get<0> (eo)}), index_html);
}